

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

void Vec_StrPrintStr(Vec_Str_t *p,char *pStr)

{
  size_t sVar1;
  int local_1c;
  int Length;
  int i;
  char *pStr_local;
  Vec_Str_t *p_local;
  
  sVar1 = strlen(pStr);
  for (local_1c = 0; local_1c < (int)sVar1; local_1c = local_1c + 1) {
    Vec_StrPush(p,pStr[local_1c]);
  }
  return;
}

Assistant:

static inline void Vec_StrPrintStr( Vec_Str_t * p, const char * pStr )
{
    int i, Length = (int)strlen(pStr);
    for ( i = 0; i < Length; i++ )
        Vec_StrPush( p, pStr[i] );
}